

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O2

int class_decrement_reference(klass cls)

{
  int iVar1;
  
  iVar1 = 1;
  if ((cls != (klass)0x0) && ((cls->ref).count != 0)) {
    LOCK();
    (cls->ref).count = (cls->ref).count - 1;
    UNLOCK();
    LOCK();
    class_stats.decrements = class_stats.decrements + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int class_decrement_reference(klass cls)
{
	if (cls == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&cls->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(class_stats);

	return 0;
}